

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionCond.cpp
# Opt level: O3

Instruction *
Hpipe::InstructionCond::make_cond
          (Node *node,PtrPool<Hpipe::Instruction,_32> *inst_pool,Cond *not_in,bool in_a_cycle,
          InstructionMark *mark,int off_data)

{
  Vec<Hpipe::Transition> *pVVar1;
  uchar b;
  Node *pNVar2;
  InstructionMark *pIVar3;
  undefined4 uVar4;
  Instruction *pIVar5;
  int iVar6;
  Cond *pCVar7;
  PtrPool<Hpipe::Instruction,_32> *pPVar8;
  InstructionCond *pIVar9;
  Instruction *pIVar10;
  bool bVar11;
  undefined7 in_register_00000009;
  Cond cond;
  Cond local_128;
  undefined4 local_fc;
  Instruction *local_f8;
  InstructionCond *local_f0;
  Context local_e8;
  int local_74;
  Instruction *local_70;
  InstructionMark *local_68;
  Cond *local_60;
  PtrPool<Hpipe::Instruction,_32> *local_58;
  Cond local_50;
  
  pNVar2 = (node->ok).data;
  if (pNVar2 == (Node *)0x0) {
    pIVar9 = (InstructionCond *)node->inst;
  }
  else {
    local_fc = (undefined4)CONCAT71(in_register_00000009,in_a_cycle);
    local_f0 = (InstructionCond *)pNVar2->freq;
    local_f8 = (Instruction *)((node->ko).data)->freq;
    local_74 = off_data;
    local_68 = mark;
    local_60 = not_in;
    local_58 = inst_pool;
    if (node->use_equ == true) {
      b = (uchar)node->beg;
      Cond::Cond(&local_50,b,b);
      pIVar9 = (InstructionCond *)operator_new(0x1c0);
      if ((double)local_f8 <= (double)local_f0) {
        Context::Context(&local_e8,0);
        InstructionCond(pIVar9,&local_e8,&local_50,off_data,not_in);
        pIVar9 = PtrPool<Hpipe::Instruction,32>::operator<<
                           ((PtrPool<Hpipe::Instruction,32> *)inst_pool,pIVar9);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>_>
        ::~_Rb_tree(&local_e8.paths_to_strings._M_t);
        if (local_e8.paths_to_mark.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_e8.paths_to_mark.
                          super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_e8.paths_to_mark.
                                super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_e8.paths_to_mark.
                                super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        pIVar3 = local_68;
        local_f0 = pIVar9;
        if (local_e8.pos.
            super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_e8.pos.
                          super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          .
                          super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_e8.pos.
                                super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                .
                                super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_e8.pos.
                                super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                .
                                super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        pNVar2 = (node->ok).data;
        Cond::operator~(&local_50);
        pCVar7 = local_60;
        Cond::operator|(local_60,&local_128);
        pPVar8 = local_58;
        iVar6 = local_74;
        bVar11 = local_fc._0_1_;
        local_70 = make_cond(pNVar2,local_58,(Cond *)&local_e8,local_fc._0_1_,pIVar3,local_74);
        local_f8 = (Instruction *)(node->ko).data;
        Cond::operator|(pCVar7,&local_50);
        pIVar10 = make_cond((Node *)local_f8,pPVar8,(Cond *)&local_e8,bVar11,pIVar3,iVar6);
        pIVar5 = local_70;
        local_128.p.super__Base_bitset<4UL>._M_w[0] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[1] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[2] = 0;
        local_f8 = (Instruction *)node;
        Transition::Transition
                  ((Transition *)&local_e8,local_70,(Vec<unsigned_int> *)&local_128,
                   ((node->ok).data)->freq);
        pIVar9 = local_f0;
        pVVar1 = &(local_f0->super_Instruction).next;
        std::vector<Hpipe::Transition,std::allocator<Hpipe::Transition>>::
        emplace_back<Hpipe::Transition_const&>
                  ((vector<Hpipe::Transition,std::allocator<Hpipe::Transition>> *)pVVar1,
                   (Transition *)&local_e8);
        uVar4 = local_fc;
        if (local_e8.pos.
            super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
          operator_delete(local_e8.pos.
                          super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          .
                          super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                          (long)local_e8.mark -
                          (long)local_e8.pos.
                                super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                .
                                super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish);
        }
        if ((void *)local_128.p.super__Base_bitset<4UL>._M_w[0] != (void *)0x0) {
          operator_delete((void *)local_128.p.super__Base_bitset<4UL>._M_w[0],
                          local_128.p.super__Base_bitset<4UL>._M_w[2] -
                          local_128.p.super__Base_bitset<4UL>._M_w[0]);
        }
        local_128.p.super__Base_bitset<4UL>._M_w[0] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[1] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[2] = 0;
        Transition::Transition
                  ((Transition *)&local_e8,&pIVar9->super_Instruction,
                   (Vec<unsigned_int> *)&local_128,-1.0);
        std::vector<Hpipe::Transition,std::allocator<Hpipe::Transition>>::
        emplace_back<Hpipe::Transition_const&>
                  ((vector<Hpipe::Transition,std::allocator<Hpipe::Transition>> *)&pIVar5->prev,
                   (Transition *)&local_e8);
        if (local_e8.pos.
            super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
          operator_delete(local_e8.pos.
                          super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          .
                          super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                          (long)local_e8.mark -
                          (long)local_e8.pos.
                                super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                .
                                super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish);
        }
        if ((void *)local_128.p.super__Base_bitset<4UL>._M_w[0] != (void *)0x0) {
          operator_delete((void *)local_128.p.super__Base_bitset<4UL>._M_w[0],
                          local_128.p.super__Base_bitset<4UL>._M_w[2] -
                          local_128.p.super__Base_bitset<4UL>._M_w[0]);
        }
        local_128.p.super__Base_bitset<4UL>._M_w[0] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[1] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[2] = 0;
        Transition::Transition
                  ((Transition *)&local_e8,pIVar10,(Vec<unsigned_int> *)&local_128,
                   (double)(local_f8->cx).pos.
                           super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                           .
                           super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage[6]);
        std::vector<Hpipe::Transition,std::allocator<Hpipe::Transition>>::
        emplace_back<Hpipe::Transition_const&>
                  ((vector<Hpipe::Transition,std::allocator<Hpipe::Transition>> *)pVVar1,
                   (Transition *)&local_e8);
        if (local_e8.pos.
            super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
          operator_delete(local_e8.pos.
                          super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          .
                          super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                          (long)local_e8.mark -
                          (long)local_e8.pos.
                                super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                .
                                super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish);
        }
        if ((void *)local_128.p.super__Base_bitset<4UL>._M_w[0] != (void *)0x0) {
          operator_delete((void *)local_128.p.super__Base_bitset<4UL>._M_w[0],
                          local_128.p.super__Base_bitset<4UL>._M_w[2] -
                          local_128.p.super__Base_bitset<4UL>._M_w[0]);
        }
        local_128.p.super__Base_bitset<4UL>._M_w[0] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[1] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[2] = 0;
        Transition::Transition
                  ((Transition *)&local_e8,&pIVar9->super_Instruction,
                   (Vec<unsigned_int> *)&local_128,-1.0);
        std::vector<Hpipe::Transition,std::allocator<Hpipe::Transition>>::
        emplace_back<Hpipe::Transition_const&>
                  ((vector<Hpipe::Transition,std::allocator<Hpipe::Transition>> *)&pIVar10->prev,
                   (Transition *)&local_e8);
      }
      else {
        Context::Context(&local_e8,0);
        Cond::operator~(&local_50);
        InstructionCond(pIVar9,&local_e8,&local_128,off_data,not_in);
        pIVar9 = PtrPool<Hpipe::Instruction,32>::operator<<
                           ((PtrPool<Hpipe::Instruction,32> *)inst_pool,pIVar9);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>_>
        ::~_Rb_tree(&local_e8.paths_to_strings._M_t);
        if (local_e8.paths_to_mark.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_e8.paths_to_mark.
                          super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_e8.paths_to_mark.
                                super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_e8.paths_to_mark.
                                super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        local_f0 = pIVar9;
        if (local_e8.pos.
            super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_e8.pos.
                          super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          .
                          super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_e8.pos.
                                super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                .
                                super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_e8.pos.
                                super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                .
                                super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        pCVar7 = local_60;
        pNVar2 = (node->ko).data;
        Cond::operator|(local_60,&local_50);
        pPVar8 = local_58;
        pIVar3 = local_68;
        bVar11 = local_fc._0_1_;
        local_f8 = make_cond(pNVar2,local_58,(Cond *)&local_e8,local_fc._0_1_,local_68,off_data);
        local_70 = (Instruction *)(node->ok).data;
        Cond::operator~(&local_50);
        Cond::operator|(pCVar7,&local_128);
        pIVar10 = make_cond((Node *)local_70,pPVar8,(Cond *)&local_e8,bVar11,pIVar3,local_74);
        pIVar5 = local_f8;
        local_128.p.super__Base_bitset<4UL>._M_w[0] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[1] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[2] = 0;
        Transition::Transition
                  ((Transition *)&local_e8,local_f8,(Vec<unsigned_int> *)&local_128,
                   ((node->ko).data)->freq);
        pIVar9 = local_f0;
        pVVar1 = &(local_f0->super_Instruction).next;
        std::vector<Hpipe::Transition,std::allocator<Hpipe::Transition>>::
        emplace_back<Hpipe::Transition_const&>
                  ((vector<Hpipe::Transition,std::allocator<Hpipe::Transition>> *)pVVar1,
                   (Transition *)&local_e8);
        if (local_e8.pos.
            super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
          operator_delete(local_e8.pos.
                          super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          .
                          super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                          (long)local_e8.mark -
                          (long)local_e8.pos.
                                super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                .
                                super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish);
        }
        if ((void *)local_128.p.super__Base_bitset<4UL>._M_w[0] != (void *)0x0) {
          operator_delete((void *)local_128.p.super__Base_bitset<4UL>._M_w[0],
                          local_128.p.super__Base_bitset<4UL>._M_w[2] -
                          local_128.p.super__Base_bitset<4UL>._M_w[0]);
        }
        local_128.p.super__Base_bitset<4UL>._M_w[0] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[1] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[2] = 0;
        Transition::Transition
                  ((Transition *)&local_e8,&pIVar9->super_Instruction,
                   (Vec<unsigned_int> *)&local_128,-1.0);
        std::vector<Hpipe::Transition,std::allocator<Hpipe::Transition>>::
        emplace_back<Hpipe::Transition_const&>
                  ((vector<Hpipe::Transition,std::allocator<Hpipe::Transition>> *)&pIVar5->prev,
                   (Transition *)&local_e8);
        if (local_e8.pos.
            super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
          operator_delete(local_e8.pos.
                          super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          .
                          super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                          (long)local_e8.mark -
                          (long)local_e8.pos.
                                super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                .
                                super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish);
        }
        if ((void *)local_128.p.super__Base_bitset<4UL>._M_w[0] != (void *)0x0) {
          operator_delete((void *)local_128.p.super__Base_bitset<4UL>._M_w[0],
                          local_128.p.super__Base_bitset<4UL>._M_w[2] -
                          local_128.p.super__Base_bitset<4UL>._M_w[0]);
        }
        local_128.p.super__Base_bitset<4UL>._M_w[0] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[1] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[2] = 0;
        Transition::Transition
                  ((Transition *)&local_e8,pIVar10,(Vec<unsigned_int> *)&local_128,
                   ((node->ok).data)->freq);
        std::vector<Hpipe::Transition,std::allocator<Hpipe::Transition>>::
        emplace_back<Hpipe::Transition_const&>
                  ((vector<Hpipe::Transition,std::allocator<Hpipe::Transition>> *)pVVar1,
                   (Transition *)&local_e8);
        if (local_e8.pos.
            super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
          operator_delete(local_e8.pos.
                          super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          .
                          super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                          (long)local_e8.mark -
                          (long)local_e8.pos.
                                super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                .
                                super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish);
        }
        if ((void *)local_128.p.super__Base_bitset<4UL>._M_w[0] != (void *)0x0) {
          operator_delete((void *)local_128.p.super__Base_bitset<4UL>._M_w[0],
                          local_128.p.super__Base_bitset<4UL>._M_w[2] -
                          local_128.p.super__Base_bitset<4UL>._M_w[0]);
        }
        local_128.p.super__Base_bitset<4UL>._M_w[0] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[1] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[2] = 0;
        Transition::Transition
                  ((Transition *)&local_e8,&pIVar9->super_Instruction,
                   (Vec<unsigned_int> *)&local_128,-1.0);
        std::vector<Hpipe::Transition,std::allocator<Hpipe::Transition>>::
        emplace_back<Hpipe::Transition_const&>
                  ((vector<Hpipe::Transition,std::allocator<Hpipe::Transition>> *)&pIVar10->prev,
                   (Transition *)&local_e8);
        uVar4 = local_fc;
      }
    }
    else {
      Cond::Cond(&local_50,(uchar)node->beg,0xff);
      pIVar9 = (InstructionCond *)operator_new(0x1c0);
      if ((double)local_f8 <= (double)local_f0) {
        Context::Context(&local_e8,0);
        Cond::operator~(&local_50);
        InstructionCond(pIVar9,&local_e8,&local_128,off_data,not_in);
        pIVar9 = PtrPool<Hpipe::Instruction,32>::operator<<
                           ((PtrPool<Hpipe::Instruction,32> *)inst_pool,pIVar9);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>_>
        ::~_Rb_tree(&local_e8.paths_to_strings._M_t);
        if (local_e8.paths_to_mark.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_e8.paths_to_mark.
                          super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_e8.paths_to_mark.
                                super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_e8.paths_to_mark.
                                super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        pIVar3 = local_68;
        local_f0 = pIVar9;
        if (local_e8.pos.
            super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_e8.pos.
                          super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          .
                          super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_e8.pos.
                                super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                .
                                super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_e8.pos.
                                super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                .
                                super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        pNVar2 = (node->ok).data;
        Cond::operator|(not_in,&local_50);
        pPVar8 = local_58;
        bVar11 = SUB41(local_fc,0);
        local_f8 = make_cond(pNVar2,local_58,(Cond *)&local_e8,bVar11,pIVar3,off_data);
        pNVar2 = (node->ko).data;
        Cond::operator~(&local_50);
        Cond::operator|(local_60,&local_128);
        pIVar10 = make_cond(pNVar2,pPVar8,(Cond *)&local_e8,bVar11,pIVar3,local_74);
        pIVar5 = local_f8;
        local_128.p.super__Base_bitset<4UL>._M_w[0] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[1] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[2] = 0;
        Transition::Transition
                  ((Transition *)&local_e8,local_f8,(Vec<unsigned_int> *)&local_128,
                   ((node->ok).data)->freq);
        pIVar9 = local_f0;
        pVVar1 = &(local_f0->super_Instruction).next;
        std::vector<Hpipe::Transition,std::allocator<Hpipe::Transition>>::
        emplace_back<Hpipe::Transition_const&>
                  ((vector<Hpipe::Transition,std::allocator<Hpipe::Transition>> *)pVVar1,
                   (Transition *)&local_e8);
        uVar4 = local_fc;
        if (local_e8.pos.
            super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
          operator_delete(local_e8.pos.
                          super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          .
                          super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                          (long)local_e8.mark -
                          (long)local_e8.pos.
                                super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                .
                                super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish);
        }
        if ((void *)local_128.p.super__Base_bitset<4UL>._M_w[0] != (void *)0x0) {
          operator_delete((void *)local_128.p.super__Base_bitset<4UL>._M_w[0],
                          local_128.p.super__Base_bitset<4UL>._M_w[2] -
                          local_128.p.super__Base_bitset<4UL>._M_w[0]);
        }
        local_128.p.super__Base_bitset<4UL>._M_w[0] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[1] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[2] = 0;
        Transition::Transition
                  ((Transition *)&local_e8,&pIVar9->super_Instruction,
                   (Vec<unsigned_int> *)&local_128,-1.0);
        std::vector<Hpipe::Transition,std::allocator<Hpipe::Transition>>::
        emplace_back<Hpipe::Transition_const&>
                  ((vector<Hpipe::Transition,std::allocator<Hpipe::Transition>> *)&pIVar5->prev,
                   (Transition *)&local_e8);
        if (local_e8.pos.
            super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
          operator_delete(local_e8.pos.
                          super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          .
                          super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                          (long)local_e8.mark -
                          (long)local_e8.pos.
                                super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                .
                                super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish);
        }
        if ((void *)local_128.p.super__Base_bitset<4UL>._M_w[0] != (void *)0x0) {
          operator_delete((void *)local_128.p.super__Base_bitset<4UL>._M_w[0],
                          local_128.p.super__Base_bitset<4UL>._M_w[2] -
                          local_128.p.super__Base_bitset<4UL>._M_w[0]);
        }
        local_128.p.super__Base_bitset<4UL>._M_w[0] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[1] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[2] = 0;
        Transition::Transition
                  ((Transition *)&local_e8,pIVar10,(Vec<unsigned_int> *)&local_128,
                   ((node->ko).data)->freq);
        std::vector<Hpipe::Transition,std::allocator<Hpipe::Transition>>::
        emplace_back<Hpipe::Transition_const&>
                  ((vector<Hpipe::Transition,std::allocator<Hpipe::Transition>> *)pVVar1,
                   (Transition *)&local_e8);
        pIVar3 = local_68;
        if (local_e8.pos.
            super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
          operator_delete(local_e8.pos.
                          super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          .
                          super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                          (long)local_e8.mark -
                          (long)local_e8.pos.
                                super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                .
                                super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish);
        }
        if ((void *)local_128.p.super__Base_bitset<4UL>._M_w[0] != (void *)0x0) {
          operator_delete((void *)local_128.p.super__Base_bitset<4UL>._M_w[0],
                          local_128.p.super__Base_bitset<4UL>._M_w[2] -
                          local_128.p.super__Base_bitset<4UL>._M_w[0]);
        }
        local_128.p.super__Base_bitset<4UL>._M_w[0] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[1] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[2] = 0;
        Transition::Transition
                  ((Transition *)&local_e8,&pIVar9->super_Instruction,
                   (Vec<unsigned_int> *)&local_128,-1.0);
        std::vector<Hpipe::Transition,std::allocator<Hpipe::Transition>>::
        emplace_back<Hpipe::Transition_const&>
                  ((vector<Hpipe::Transition,std::allocator<Hpipe::Transition>> *)&pIVar10->prev,
                   (Transition *)&local_e8);
      }
      else {
        Context::Context(&local_e8,0);
        InstructionCond(pIVar9,&local_e8,&local_50,off_data,not_in);
        pIVar9 = PtrPool<Hpipe::Instruction,32>::operator<<
                           ((PtrPool<Hpipe::Instruction,32> *)inst_pool,pIVar9);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>_>
        ::~_Rb_tree(&local_e8.paths_to_strings._M_t);
        if (local_e8.paths_to_mark.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_e8.paths_to_mark.
                          super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_e8.paths_to_mark.
                                super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_e8.paths_to_mark.
                                super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        pIVar3 = local_68;
        local_f0 = pIVar9;
        if (local_e8.pos.
            super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_e8.pos.
                          super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          .
                          super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_e8.pos.
                                super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                .
                                super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_e8.pos.
                                super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                .
                                super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        pNVar2 = (node->ko).data;
        Cond::operator~(&local_50);
        pCVar7 = local_60;
        Cond::operator|(local_60,&local_128);
        pPVar8 = local_58;
        iVar6 = local_74;
        bVar11 = local_fc._0_1_;
        local_70 = make_cond(pNVar2,local_58,(Cond *)&local_e8,local_fc._0_1_,pIVar3,local_74);
        local_f8 = (Instruction *)(node->ok).data;
        Cond::operator|(pCVar7,&local_50);
        pIVar10 = make_cond((Node *)local_f8,pPVar8,(Cond *)&local_e8,bVar11,pIVar3,iVar6);
        pIVar5 = local_70;
        local_128.p.super__Base_bitset<4UL>._M_w[0] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[1] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[2] = 0;
        local_f8 = (Instruction *)node;
        Transition::Transition
                  ((Transition *)&local_e8,local_70,(Vec<unsigned_int> *)&local_128,
                   ((node->ko).data)->freq);
        pIVar9 = local_f0;
        pVVar1 = &(local_f0->super_Instruction).next;
        std::vector<Hpipe::Transition,std::allocator<Hpipe::Transition>>::
        emplace_back<Hpipe::Transition_const&>
                  ((vector<Hpipe::Transition,std::allocator<Hpipe::Transition>> *)pVVar1,
                   (Transition *)&local_e8);
        uVar4 = local_fc;
        if (local_e8.pos.
            super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
          operator_delete(local_e8.pos.
                          super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          .
                          super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                          (long)local_e8.mark -
                          (long)local_e8.pos.
                                super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                .
                                super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish);
        }
        if ((void *)local_128.p.super__Base_bitset<4UL>._M_w[0] != (void *)0x0) {
          operator_delete((void *)local_128.p.super__Base_bitset<4UL>._M_w[0],
                          local_128.p.super__Base_bitset<4UL>._M_w[2] -
                          local_128.p.super__Base_bitset<4UL>._M_w[0]);
        }
        local_128.p.super__Base_bitset<4UL>._M_w[0] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[1] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[2] = 0;
        Transition::Transition
                  ((Transition *)&local_e8,&pIVar9->super_Instruction,
                   (Vec<unsigned_int> *)&local_128,-1.0);
        std::vector<Hpipe::Transition,std::allocator<Hpipe::Transition>>::
        emplace_back<Hpipe::Transition_const&>
                  ((vector<Hpipe::Transition,std::allocator<Hpipe::Transition>> *)&pIVar5->prev,
                   (Transition *)&local_e8);
        if (local_e8.pos.
            super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
          operator_delete(local_e8.pos.
                          super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          .
                          super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                          (long)local_e8.mark -
                          (long)local_e8.pos.
                                super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                .
                                super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish);
        }
        if ((void *)local_128.p.super__Base_bitset<4UL>._M_w[0] != (void *)0x0) {
          operator_delete((void *)local_128.p.super__Base_bitset<4UL>._M_w[0],
                          local_128.p.super__Base_bitset<4UL>._M_w[2] -
                          local_128.p.super__Base_bitset<4UL>._M_w[0]);
        }
        local_128.p.super__Base_bitset<4UL>._M_w[0] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[1] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[2] = 0;
        Transition::Transition
                  ((Transition *)&local_e8,pIVar10,(Vec<unsigned_int> *)&local_128,
                   ((Node *)(local_f8->cx).pos.
                            super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                            .
                            super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                            ._M_impl.super__Vector_impl_data._M_start)->freq);
        std::vector<Hpipe::Transition,std::allocator<Hpipe::Transition>>::
        emplace_back<Hpipe::Transition_const&>
                  ((vector<Hpipe::Transition,std::allocator<Hpipe::Transition>> *)pVVar1,
                   (Transition *)&local_e8);
        if (local_e8.pos.
            super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
            _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
          operator_delete(local_e8.pos.
                          super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          .
                          super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                          (long)local_e8.mark -
                          (long)local_e8.pos.
                                super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                .
                                super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish);
        }
        if ((void *)local_128.p.super__Base_bitset<4UL>._M_w[0] != (void *)0x0) {
          operator_delete((void *)local_128.p.super__Base_bitset<4UL>._M_w[0],
                          local_128.p.super__Base_bitset<4UL>._M_w[2] -
                          local_128.p.super__Base_bitset<4UL>._M_w[0]);
        }
        local_128.p.super__Base_bitset<4UL>._M_w[0] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[1] = 0;
        local_128.p.super__Base_bitset<4UL>._M_w[2] = 0;
        Transition::Transition
                  ((Transition *)&local_e8,&pIVar9->super_Instruction,
                   (Vec<unsigned_int> *)&local_128,-1.0);
        std::vector<Hpipe::Transition,std::allocator<Hpipe::Transition>>::
        emplace_back<Hpipe::Transition_const&>
                  ((vector<Hpipe::Transition,std::allocator<Hpipe::Transition>> *)&pIVar10->prev,
                   (Transition *)&local_e8);
      }
    }
    if (local_e8.pos.super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
        .super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
        _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
      operator_delete(local_e8.pos.
                      super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                      .
                      super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
                      (long)local_e8.mark -
                      (long)local_e8.pos.
                            super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                            .
                            super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
    }
    if ((void *)local_128.p.super__Base_bitset<4UL>._M_w[0] != (void *)0x0) {
      operator_delete((void *)local_128.p.super__Base_bitset<4UL>._M_w[0],
                      local_128.p.super__Base_bitset<4UL>._M_w[2] -
                      local_128.p.super__Base_bitset<4UL>._M_w[0]);
    }
    (pIVar9->super_Instruction).in_a_cycle = SUB41(uVar4,0);
    (pIVar9->super_Instruction).mark = pIVar3;
  }
  return &pIVar9->super_Instruction;
}

Assistant:

Instruction *InstructionCond::make_cond( const BranchSet::Node *node, PtrPool<Instruction> &inst_pool, const Cond &not_in, bool in_a_cycle, InstructionMark *mark, int off_data ) {
    if ( node->ok ) {
        bool use_neg = node->ok->freq < node->ko->freq;
        if ( node->use_equ ) {
            Cond cond( node->beg, node->beg );
            if ( use_neg ) {
                Instruction *res = inst_pool << new InstructionCond( {}, ~ cond, off_data, not_in );
                Instruction *ko = make_cond( node->ko.ptr(), inst_pool, not_in |   cond, in_a_cycle, mark, off_data );
                Instruction *ok = make_cond( node->ok.ptr(), inst_pool, not_in | ~ cond, in_a_cycle, mark, off_data );
                res->next << Transition( ko, {}, node->ko->freq ); ko->prev << res;
                res->next << Transition( ok, {}, node->ok->freq ); ok->prev << res;
                res->in_a_cycle = in_a_cycle;
                res->mark = mark;
                return res;
            }
            Instruction *res = inst_pool << new InstructionCond( {}, cond, off_data, not_in );
            Instruction *ok = make_cond( node->ok.ptr(), inst_pool, not_in | ~ cond, in_a_cycle, mark, off_data );
            Instruction *ko = make_cond( node->ko.ptr(), inst_pool, not_in |   cond, in_a_cycle, mark, off_data );
            res->next << Transition( ok, {}, node->ok->freq ); ok->prev << res;
            res->next << Transition( ko, {}, node->ko->freq ); ko->prev << res;
            res->in_a_cycle = in_a_cycle;
            res->mark = mark;
            return res;
        }
        Cond cond( node->beg, 255 );
        if ( use_neg ) {
            Instruction *res = inst_pool << new InstructionCond( {}, cond, off_data, not_in );
            Instruction *ko = make_cond( node->ko.ptr(), inst_pool, not_in | ~ cond, in_a_cycle, mark, off_data );
            Instruction *ok = make_cond( node->ok.ptr(), inst_pool, not_in |   cond, in_a_cycle, mark, off_data );
            res->next << Transition( ko, {}, node->ko->freq ); ko->prev << res;
            res->next << Transition( ok, {}, node->ok->freq ); ok->prev << res;
            res->in_a_cycle = in_a_cycle;
            res->mark = mark;
            return res;
        }
        Instruction *res = inst_pool << new InstructionCond( {}, ~ cond, off_data, not_in );
        Instruction *ok = make_cond( node->ok.ptr(), inst_pool, not_in |   cond, in_a_cycle, mark, off_data );
        Instruction *ko = make_cond( node->ko.ptr(), inst_pool, not_in | ~ cond, in_a_cycle, mark, off_data );
        res->next << Transition( ok, {}, node->ok->freq ); ok->prev << res;
        res->next << Transition( ko, {}, node->ko->freq ); ko->prev << res;
        res->in_a_cycle = in_a_cycle;
        res->mark = mark;
        return res;
    }
    return node->inst;
}